

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O3

ostream * foxxll::operator<<(ostream *o,stats *s)

{
  stats_data local_60;
  
  stats_data::stats_data(&local_60,s);
  operator<<(o,&local_60);
  if (local_60.file_stats_data_list_.
      super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.file_stats_data_list_.
                    super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.file_stats_data_list_.
                          super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.file_stats_data_list_.
                          super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return o;
}

Assistant:

std::ostream& operator << (std::ostream& o, const stats& s)
{
    o << stats_data(s);
    return o;
}